

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

void __thiscall QtMWidgets::Section::Section(Section *this)

{
  Section *this_local;
  
  this->type = NoSection;
  this->zeroesAdded = false;
  this->sectionWidth = 0;
  QList<QString>::QList(&this->values);
  this->currentIndex = -1;
  this->offset = 0;
  return;
}

Assistant:

Section::Section()
	:	type( NoSection )
	,	zeroesAdded( false )
	,	sectionWidth( 0 )
	,	currentIndex( -1 )
	,	offset( 0 )
{
}